

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaBlast.c
# Opt level: O1

int Cba_BlastReduction(Gia_Man_t *pNew,int *pFans,int nFans,int Type)

{
  int iVar1;
  ulong uVar2;
  
  if (Type == 0x1b) {
    if (nFans < 1) {
      iVar1 = 1;
    }
    else {
      iVar1 = 1;
      uVar2 = 0;
      do {
        iVar1 = Gia_ManHashAnd(pNew,iVar1,pFans[uVar2]);
        uVar2 = uVar2 + 1;
      } while ((uint)nFans != uVar2);
    }
  }
  else {
    if (Type == 0x1d) {
      if (0 < nFans) {
        uVar2 = 0;
        iVar1 = 0;
        do {
          iVar1 = Gia_ManHashOr(pNew,iVar1,pFans[uVar2]);
          uVar2 = uVar2 + 1;
        } while ((uint)nFans != uVar2);
        return iVar1;
      }
    }
    else {
      if (Type != 0x1f) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaBlast.c"
                      ,0xf7,"int Cba_BlastReduction(Gia_Man_t *, int *, int, int)");
      }
      if (0 < nFans) {
        uVar2 = 0;
        iVar1 = 0;
        do {
          iVar1 = Gia_ManHashXor(pNew,iVar1,pFans[uVar2]);
          uVar2 = uVar2 + 1;
        } while ((uint)nFans != uVar2);
        return iVar1;
      }
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int Cba_BlastReduction( Gia_Man_t * pNew, int * pFans, int nFans, int Type )
{
    if ( Type == CBA_BOX_RAND )
    {
        int k, iLit = 1;
        for ( k = 0; k < nFans; k++ )
            iLit = Gia_ManHashAnd( pNew, iLit, pFans[k] );
        return iLit;
    }
    if ( Type == CBA_BOX_ROR )
    {
        int k, iLit = 0;
        for ( k = 0; k < nFans; k++ )
            iLit = Gia_ManHashOr( pNew, iLit, pFans[k] );
        return iLit;
    }
    if ( Type == CBA_BOX_RXOR )
    {
        int k, iLit = 0;
        for ( k = 0; k < nFans; k++ )
            iLit = Gia_ManHashXor( pNew, iLit, pFans[k] );
        return iLit;
    }
    assert( 0 );
    return -1;
}